

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O1

int Centaurus::LookaheadDFA<char>::get_closure_color(CATNClosure *closure)

{
  _Rb_tree_color _Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_color _Var3;
  
  p_Var2 = (closure->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  _Var3 = _S_red;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(closure->_M_t)._M_impl.super__Rb_tree_header) {
      return _Var3;
    }
    _Var1 = p_Var2[2]._M_color;
    if (((_Var3 != _S_red) && (_Var3 != _Var1)) && (_Var1 != _S_red)) break;
    if (_Var3 == _S_red) {
      _Var3 = _Var1;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  return -1;
}

Assistant:

static int get_closure_color(const CATNClosure& closure)
	{
		int color = 0;
		for (const auto& p : closure)
		{
			if (color == 0)
			{
				color = p.color();
			}
			else
			{
				if (color != p.color() && p.color() != 0)
					return -1;
			}
		}
		return color;
	}